

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  Resume *pRVar1;
  StackSwitch *pSVar2;
  ArrayInitData *pAVar3;
  MemoryFill *pMVar4;
  MemoryCopy *pMVar5;
  Call *pCVar6;
  ArrayInitElem *pAVar7;
  TryTable *pTVar8;
  TableInit *pTVar9;
  CallIndirect *pCVar10;
  Try *pTVar11;
  AtomicCmpxchg *pAVar12;
  RefFunc *pRVar13;
  MemoryGrow *pMVar14;
  GlobalGet *pGVar15;
  Store *pSVar16;
  MemorySize *pMVar17;
  AtomicRMW *pAVar18;
  TableSize *pTVar19;
  SIMDLoadStoreLane *pSVar20;
  MemoryInit *pMVar21;
  TableCopy *pTVar22;
  ResumeThrow *pRVar23;
  Name *pNVar24;
  uint uVar25;
  ulong uVar26;
  ModuleItemKind MStack_40;
  
  switch(curr->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    wasm::Expression::cast<wasm::Block>(curr);
    return;
  case IfId:
    wasm::Expression::cast<wasm::If>(curr);
    return;
  case LoopId:
    wasm::Expression::cast<wasm::Loop>(curr);
    return;
  case BreakId:
    wasm::Expression::cast<wasm::Break>(curr);
    return;
  case SwitchId:
    wasm::Expression::cast<wasm::Switch>(curr);
    return;
  case CallId:
    pCVar6 = wasm::Expression::cast<wasm::Call>(curr);
    if ((pCVar6->target).super_IString.str._M_str == (char *)0x0) {
      return;
    }
    pSVar2 = (StackSwitch *)&pCVar6->target;
    goto LAB_0011ac67;
  case CallIndirectId:
    pCVar10 = wasm::Expression::cast<wasm::CallIndirect>(curr);
    if (*(long *)(pCVar10 + 0x48) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pCVar10 + 0x40);
    goto LAB_0011ae68;
  case LocalGetId:
    wasm::Expression::cast<wasm::LocalGet>(curr);
    return;
  case LocalSetId:
    wasm::Expression::cast<wasm::LocalSet>(curr);
    return;
  case GlobalGetId:
    pGVar15 = wasm::Expression::cast<wasm::GlobalGet>(curr);
    goto LAB_0011ad19;
  case GlobalSetId:
    pGVar15 = (GlobalGet *)wasm::Expression::cast<wasm::GlobalSet>(curr);
LAB_0011ad19:
    if (*(long *)(pGVar15 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pGVar15 + 0x10);
    MStack_40 = Global;
    goto LAB_0011af5d;
  case LoadId:
    pAVar12 = (AtomicCmpxchg *)wasm::Expression::cast<wasm::Load>(curr);
    goto LAB_0011ac1e;
  case StoreId:
    pSVar16 = wasm::Expression::cast<wasm::Store>(curr);
    if (*(long *)(pSVar16 + 0x50) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pSVar16 + 0x48);
    break;
  case ConstId:
    wasm::Expression::cast<wasm::Const>(curr);
    return;
  case UnaryId:
    wasm::Expression::cast<wasm::Unary>(curr);
    return;
  case BinaryId:
    wasm::Expression::cast<wasm::Binary>(curr);
    return;
  case SelectId:
    wasm::Expression::cast<wasm::Select>(curr);
    return;
  case DropId:
    wasm::Expression::cast<wasm::Drop>(curr);
    return;
  case ReturnId:
    wasm::Expression::cast<wasm::Return>(curr);
    return;
  case MemorySizeId:
    pMVar17 = wasm::Expression::cast<wasm::MemorySize>(curr);
    if (*(long *)(pMVar17 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pMVar17 + 0x10);
    break;
  case MemoryGrowId:
    pMVar14 = wasm::Expression::cast<wasm::MemoryGrow>(curr);
    if (*(long *)(pMVar14 + 0x20) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pMVar14 + 0x18);
    break;
  case NopId:
    wasm::Expression::cast<wasm::Nop>(curr);
    return;
  case UnreachableId:
    wasm::Expression::cast<wasm::Unreachable>(curr);
    return;
  case AtomicRMWId:
    pAVar18 = wasm::Expression::cast<wasm::AtomicRMW>(curr);
    goto LAB_0011ae36;
  case AtomicCmpxchgId:
    pAVar12 = wasm::Expression::cast<wasm::AtomicCmpxchg>(curr);
    goto LAB_0011ac1e;
  case AtomicWaitId:
    pAVar12 = (AtomicCmpxchg *)wasm::Expression::cast<wasm::AtomicWait>(curr);
LAB_0011ac1e:
    if (*(long *)(pAVar12 + 0x40) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pAVar12 + 0x38);
    break;
  case AtomicNotifyId:
    pMVar4 = (MemoryFill *)wasm::Expression::cast<wasm::AtomicNotify>(curr);
    goto LAB_0011aa67;
  case AtomicFenceId:
    wasm::Expression::cast<wasm::AtomicFence>(curr);
    return;
  case SIMDExtractId:
    wasm::Expression::cast<wasm::SIMDExtract>(curr);
    return;
  case SIMDReplaceId:
    wasm::Expression::cast<wasm::SIMDReplace>(curr);
    return;
  case SIMDShuffleId:
    wasm::Expression::cast<wasm::SIMDShuffle>(curr);
    return;
  case SIMDTernaryId:
    wasm::Expression::cast<wasm::SIMDTernary>(curr);
    return;
  case SIMDShiftId:
    wasm::Expression::cast<wasm::SIMDShift>(curr);
    return;
  case SIMDLoadId:
    pAVar18 = (AtomicRMW *)wasm::Expression::cast<wasm::SIMDLoad>(curr);
LAB_0011ae36:
    if (*(long *)(pAVar18 + 0x38) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pAVar18 + 0x30);
    break;
  case SIMDLoadStoreLaneId:
    pSVar20 = wasm::Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    if (*(long *)(pSVar20 + 0x48) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pSVar20 + 0x40);
    break;
  case MemoryInitId:
    pMVar21 = wasm::Expression::cast<wasm::MemoryInit>(curr);
    if (*(long *)(pMVar21 + 0x18) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(pMVar21 + 0x10));
    }
    if (*(long *)(pMVar21 + 0x40) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pMVar21 + 0x38);
    goto LAB_0011aeff;
  case DataDropId:
    pAVar3 = (ArrayInitData *)wasm::Expression::cast<wasm::DataDrop>(curr);
    goto LAB_0011a85b;
  case MemoryCopyId:
    pMVar5 = wasm::Expression::cast<wasm::MemoryCopy>(curr);
    if (*(long *)(pMVar5 + 0x40) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar5 + 0x38));
    }
    if (*(long *)(pMVar5 + 0x30) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pMVar5 + 0x28);
LAB_0011aeff:
    MStack_40 = Memory;
    goto LAB_0011af5d;
  case MemoryFillId:
    pMVar4 = wasm::Expression::cast<wasm::MemoryFill>(curr);
LAB_0011aa67:
    if (*(long *)(pMVar4 + 0x30) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pMVar4 + 0x28);
    break;
  case PopId:
    wasm::Expression::cast<wasm::Pop>(curr);
    return;
  case RefNullId:
    wasm::Expression::cast<wasm::RefNull>(curr);
    return;
  case RefIsNullId:
    wasm::Expression::cast<wasm::RefIsNull>(curr);
    return;
  case RefFuncId:
    pRVar13 = wasm::Expression::cast<wasm::RefFunc>(curr);
    if (*(long *)(pRVar13 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pRVar13 + 0x10);
LAB_0011ac67:
    MStack_40 = Function;
    goto LAB_0011af5d;
  case RefEqId:
    wasm::Expression::cast<wasm::RefEq>(curr);
    return;
  case TableGetId:
    pTVar19 = (TableSize *)wasm::Expression::cast<wasm::TableGet>(curr);
    goto LAB_0011ae59;
  case TableSetId:
    pTVar19 = (TableSize *)wasm::Expression::cast<wasm::TableSet>(curr);
    goto LAB_0011ae59;
  case TableSizeId:
    pTVar19 = wasm::Expression::cast<wasm::TableSize>(curr);
    goto LAB_0011ae59;
  case TableGrowId:
    pTVar19 = (TableSize *)wasm::Expression::cast<wasm::TableGrow>(curr);
    goto LAB_0011ae59;
  case TableFillId:
    pTVar19 = (TableSize *)wasm::Expression::cast<wasm::TableFill>(curr);
LAB_0011ae59:
    if (*(long *)(pTVar19 + 0x18) == 0) {
switchD_0011a6be_default:
      return;
    }
    pSVar2 = (StackSwitch *)(pTVar19 + 0x10);
LAB_0011ae68:
    MStack_40 = Table;
    goto LAB_0011af5d;
  case TableCopyId:
    pTVar22 = wasm::Expression::cast<wasm::TableCopy>(curr);
    if (*(long *)(pTVar22 + 0x40) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar22 + 0x38));
    }
    if (*(long *)(pTVar22 + 0x30) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pTVar22 + 0x28);
    goto LAB_0011af36;
  case TableInitId:
    pTVar9 = wasm::Expression::cast<wasm::TableInit>(curr);
    if (*(long *)(pTVar9 + 0x18) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,ElementSegment,(Name *)(pTVar9 + 0x10));
    }
    if (*(long *)(pTVar9 + 0x40) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pTVar9 + 0x38);
LAB_0011af36:
    MStack_40 = Table;
    goto LAB_0011af5d;
  case TryId:
    pTVar11 = wasm::Expression::cast<wasm::Try>(curr);
    for (uVar25 = 0; uVar26 = (ulong)uVar25, uVar26 < *(ulong *)(pTVar11 + 0x30);
        uVar25 = uVar25 + 1) {
      pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar11 + 0x28),
                           uVar26);
      if ((pNVar24->super_IString).str._M_str != (char *)0x0) {
        pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pTVar11 + 0x28),uVar26);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar24);
      }
    }
    return;
  case TryTableId:
    pTVar8 = wasm::Expression::cast<wasm::TryTable>(curr);
    for (uVar25 = 0; uVar26 = (ulong)uVar25, uVar26 < *(ulong *)(pTVar8 + 0x20); uVar25 = uVar25 + 1
        ) {
      pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar8 + 0x18),
                           uVar26);
      if ((pNVar24->super_IString).str._M_str != (char *)0x0) {
        pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar8 + 0x18)
                             ,uVar26);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar24);
      }
    }
    return;
  case ThrowId:
    pSVar2 = (StackSwitch *)wasm::Expression::cast<wasm::Throw>(curr);
    goto LAB_0011af45;
  case RethrowId:
    wasm::Expression::cast<wasm::Rethrow>(curr);
    return;
  case ThrowRefId:
    wasm::Expression::cast<wasm::ThrowRef>(curr);
    return;
  case TupleMakeId:
    wasm::Expression::cast<wasm::TupleMake>(curr);
    return;
  case TupleExtractId:
    wasm::Expression::cast<wasm::TupleExtract>(curr);
    return;
  case RefI31Id:
    wasm::Expression::cast<wasm::RefI31>(curr);
    return;
  case I31GetId:
    wasm::Expression::cast<wasm::I31Get>(curr);
    return;
  case CallRefId:
    wasm::Expression::cast<wasm::CallRef>(curr);
    return;
  case RefTestId:
    wasm::Expression::cast<wasm::RefTest>(curr);
    return;
  case RefCastId:
    wasm::Expression::cast<wasm::RefCast>(curr);
    return;
  case BrOnId:
    wasm::Expression::cast<wasm::BrOn>(curr);
    return;
  case StructNewId:
    wasm::Expression::cast<wasm::StructNew>(curr);
    return;
  case StructGetId:
    wasm::Expression::cast<wasm::StructGet>(curr);
    return;
  case StructSetId:
    wasm::Expression::cast<wasm::StructSet>(curr);
    return;
  case StructRMWId:
    wasm::Expression::cast<wasm::StructRMW>(curr);
    return;
  case StructCmpxchgId:
    wasm::Expression::cast<wasm::StructCmpxchg>(curr);
    return;
  case ArrayNewId:
    wasm::Expression::cast<wasm::ArrayNew>(curr);
    return;
  case ArrayNewDataId:
    pAVar3 = (ArrayInitData *)wasm::Expression::cast<wasm::ArrayNewData>(curr);
    goto LAB_0011a85b;
  case ArrayNewElemId:
    pAVar7 = (ArrayInitElem *)wasm::Expression::cast<wasm::ArrayNewElem>(curr);
    goto LAB_0011ac3a;
  case ArrayNewFixedId:
    wasm::Expression::cast<wasm::ArrayNewFixed>(curr);
    return;
  case ArrayGetId:
    wasm::Expression::cast<wasm::ArrayGet>(curr);
    return;
  case ArraySetId:
    wasm::Expression::cast<wasm::ArraySet>(curr);
    return;
  case ArrayLenId:
    wasm::Expression::cast<wasm::ArrayLen>(curr);
    return;
  case ArrayCopyId:
    wasm::Expression::cast<wasm::ArrayCopy>(curr);
    return;
  case ArrayFillId:
    wasm::Expression::cast<wasm::ArrayFill>(curr);
    return;
  case ArrayInitDataId:
    pAVar3 = wasm::Expression::cast<wasm::ArrayInitData>(curr);
LAB_0011a85b:
    if (*(long *)(pAVar3 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pAVar3 + 0x10);
    MStack_40 = DataSegment;
    goto LAB_0011af5d;
  case ArrayInitElemId:
    pAVar7 = wasm::Expression::cast<wasm::ArrayInitElem>(curr);
LAB_0011ac3a:
    if (*(long *)(pAVar7 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pAVar7 + 0x10);
    MStack_40 = ElementSegment;
    goto LAB_0011af5d;
  case RefAsId:
    wasm::Expression::cast<wasm::RefAs>(curr);
    return;
  case StringNewId:
    wasm::Expression::cast<wasm::StringNew>(curr);
    return;
  case StringConstId:
    wasm::Expression::cast<wasm::StringConst>(curr);
    return;
  case StringMeasureId:
    wasm::Expression::cast<wasm::StringMeasure>(curr);
    return;
  case StringEncodeId:
    wasm::Expression::cast<wasm::StringEncode>(curr);
    return;
  case StringConcatId:
    wasm::Expression::cast<wasm::StringConcat>(curr);
    return;
  case StringEqId:
    wasm::Expression::cast<wasm::StringEq>(curr);
    return;
  case StringWTF16GetId:
    wasm::Expression::cast<wasm::StringWTF16Get>(curr);
    return;
  case StringSliceWTFId:
    wasm::Expression::cast<wasm::StringSliceWTF>(curr);
    return;
  case ContNewId:
    wasm::Expression::cast<wasm::ContNew>(curr);
    return;
  case ContBindId:
    wasm::Expression::cast<wasm::ContBind>(curr);
    return;
  case SuspendId:
    pSVar2 = (StackSwitch *)wasm::Expression::cast<wasm::Suspend>(curr);
    goto LAB_0011af45;
  case ResumeId:
    pRVar1 = wasm::Expression::cast<wasm::Resume>(curr);
    for (uVar25 = 0; uVar26 = (ulong)uVar25, uVar26 < *(ulong *)(pRVar1 + 0x18); uVar25 = uVar25 + 1
        ) {
      pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar1 + 0x10),
                           uVar26);
      if ((pNVar24->super_IString).str._M_str != (char *)0x0) {
        pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar1 + 0x10)
                             ,uVar26);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar24);
      }
    }
    return;
  case ResumeThrowId:
    pRVar23 = wasm::Expression::cast<wasm::ResumeThrow>(curr);
    for (uVar25 = 0; uVar26 = (ulong)uVar25, uVar26 < *(ulong *)(pRVar23 + 0x28);
        uVar25 = uVar25 + 1) {
      pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar23 + 0x20),
                           uVar26);
      if ((pNVar24->super_IString).str._M_str != (char *)0x0) {
        pNVar24 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pRVar23 + 0x20),uVar26);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar24);
      }
    }
    if (*(long *)(pRVar23 + 0x18) == 0) {
      return;
    }
    pSVar2 = (StackSwitch *)(pRVar23 + 0x10);
    MStack_40 = Tag;
    goto LAB_0011af5d;
  case StackSwitchId:
    pSVar2 = wasm::Expression::cast<wasm::StackSwitch>(curr);
LAB_0011af45:
    if (*(long *)(pSVar2 + 0x18) == 0) {
      return;
    }
    pSVar2 = pSVar2 + 0x10;
    MStack_40 = Tag;
    goto LAB_0011af5d;
  default:
    goto switchD_0011a6be_default;
  }
  MStack_40 = Memory;
LAB_0011af5d:
  mapName(wasm::ModuleItemKind,wasm::Name__(this,MStack_40,(Name *)pSVar2);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    mapName(kind, cast->field);                                                \
  }

#include "wasm-delegations-fields.def"
    }